

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-player.c
# Opt level: O3

void configure_char_sheet(void)

{
  int iVar1;
  wchar_t wVar2;
  ui_entry_iterator *puVar3;
  ui_entry **ppuVar4;
  ui_entry *puVar5;
  char_sheet_config *pcVar6;
  char_sheet_resist *pcVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  wchar_t wVar12;
  ulong uVar13;
  char *test_categories [2];
  char *local_48;
  char *local_40;
  
  release_char_sheet_config();
  cached_config = (char_sheet_config *)mem_alloc(0x88);
  local_48 = "CHAR_SCREEN1";
  local_40 = "stat_modifiers";
  puVar3 = initialize_ui_entry_iterator(check_for_two_categories,&local_48,"stat_modifiers");
  wVar2 = count_ui_entry_iterator(puVar3);
  wVar12 = L'\x05';
  if (wVar2 < L'\x05') {
    wVar12 = wVar2;
  }
  cached_config->n_stat_mod_entries = wVar12;
  ppuVar4 = (ui_entry **)mem_alloc((long)wVar12 << 3);
  cached_config->stat_mod_entries = ppuVar4;
  if (L'\0' < wVar2) {
    uVar13 = 0;
    do {
      puVar5 = advance_ui_entry_iterator(puVar3);
      cached_config->stat_mod_entries[uVar13] = puVar5;
      uVar13 = uVar13 + 1;
    } while ((uint)wVar12 != uVar13);
  }
  release_ui_entry_iterator(puVar3);
  pcVar6 = cached_config;
  cached_config->res_nlabel = L'\x06';
  pcVar6->res_cols = (uint)(player->body).count + L'\a';
  pcVar6->res_rows = L'\0';
  uVar13 = 0;
  iVar9 = 0;
  do {
    pcVar6->res_regions[uVar13].col = iVar9;
    pcVar6->res_regions[uVar13].row = 7;
    iVar8 = (uint)((uVar13 & 1) == 0) * 5 + pcVar6->res_cols;
    pcVar6->res_regions[uVar13].width = iVar8;
    local_40 = (&PTR_anon_var_dwarf_193d47_00285700)[uVar13];
    puVar3 = initialize_ui_entry_iterator(check_for_two_categories,&local_48,local_40);
    wVar2 = count_ui_entry_iterator(puVar3);
    iVar1 = cached_config->res_regions[uVar13].row;
    wVar12 = L'\x14' - iVar1;
    if (wVar2 + iVar1 + 2 < 0x17) {
      wVar12 = wVar2;
    }
    cached_config->n_resist_by_region[uVar13] = wVar12;
    pcVar7 = (char_sheet_resist *)mem_alloc((long)wVar12 << 5);
    cached_config->resists_by_region[uVar13] = pcVar7;
    if (L'\0' < wVar12) {
      lVar10 = 0x1c;
      lVar11 = 0;
      do {
        puVar5 = advance_ui_entry_iterator(puVar3);
        pcVar6 = cached_config;
        *(ui_entry **)((long)cached_config->resists_by_region[uVar13]->label + lVar10 + -0x24) =
             puVar5;
        get_ui_entry_label(puVar5,pcVar6->res_nlabel,true,
                           (wchar_t *)
                           ((long)pcVar6->resists_by_region[uVar13]->label + lVar10 + -0x1c));
        text_mbstowcs((wchar_t *)
                      ((long)cached_config->resists_by_region[uVar13]->label + lVar10 + -8),":",
                      L'\x01');
        lVar11 = lVar11 + 1;
        lVar10 = lVar10 + 0x20;
      } while (lVar11 < wVar12);
    }
    release_ui_entry_iterator(puVar3);
    pcVar6 = cached_config;
    wVar12 = cached_config->n_resist_by_region[uVar13];
    wVar2 = cached_config->res_rows;
    if (cached_config->res_rows < wVar12) {
      cached_config->res_rows = wVar12;
      wVar2 = wVar12;
    }
    iVar9 = iVar9 + iVar8 + 1;
    uVar13 = uVar13 + 1;
  } while (uVar13 != 4);
  lVar10 = 0;
  do {
    *(wchar_t *)((long)&pcVar6->res_regions[0].page_rows + lVar10) = wVar2 + L'\x02';
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x40);
  return;
}

Assistant:

static void configure_char_sheet(void)
{
	const char* region_categories[] = {
		"resistances",
		"abilities",
		"modifiers",
		"hindrances"
	};
	const char* test_categories[2];
	struct ui_entry_iterator* ui_iter;
	int i, n, next_col;

	release_char_sheet_config();

	cached_config = mem_alloc(sizeof(*cached_config));

	test_categories[0] = "CHAR_SCREEN1";
	test_categories[1] = "stat_modifiers";
	ui_iter = initialize_ui_entry_iterator(check_for_two_categories,
		test_categories, test_categories[1]);
	n = count_ui_entry_iterator(ui_iter);
	/*
	 * Linked to hardcoded stats display with STAT_MAX entries so only use
	 * that many.
	 */
	if (n > STAT_MAX) {
	    n = STAT_MAX;
	}
	cached_config->n_stat_mod_entries = n;
	cached_config->stat_mod_entries = mem_alloc(n *
		sizeof(*cached_config->stat_mod_entries));
	for (i = 0; i < n; ++i) {
		cached_config->stat_mod_entries[i] =
			advance_ui_entry_iterator(ui_iter);
	}
	release_ui_entry_iterator(ui_iter);

	cached_config->res_nlabel = 6;
	cached_config->res_cols =
		cached_config->res_nlabel + 1 + player->body.count;
	cached_config->res_rows = 0;
	next_col = 0;
	for (i = 0; i < 4; ++i) {
		int j;

		//cached_config->res_regions[i].col =
		//	i * (cached_config->res_cols + 1);
		cached_config->res_regions[i].col = next_col;
		cached_config->res_regions[i].row = 2 + STAT_MAX;
		cached_config->res_regions[i].width = cached_config->res_cols
			+ ((i % 2 == 0) ? 5 : 0);
		next_col += cached_config->res_regions[i].width + 1;

		test_categories[1] = region_categories[i];
		ui_iter = initialize_ui_entry_iterator(check_for_two_categories, test_categories, region_categories[i]);
		n = count_ui_entry_iterator(ui_iter);
		/*
		 * Fit in 24 row display; leave at least one row blank before
		 * prompt on last row.
		 */
		if (n + 2 + cached_config->res_regions[i].row > 22) {
		    n = 20 - cached_config->res_regions[i].row;
		}
		cached_config->n_resist_by_region[i] = n;
		cached_config->resists_by_region[i] = mem_alloc(n * sizeof(*cached_config->resists_by_region[i]));
		for (j = 0; j < n; ++j) {
			struct ui_entry *entry = advance_ui_entry_iterator(ui_iter);

			cached_config->resists_by_region[i][j].entry = entry;
			get_ui_entry_label(entry, cached_config->res_nlabel, true, cached_config->resists_by_region[i][j].label);
			(void) text_mbstowcs(cached_config->resists_by_region[i][j].label + 5, ":", 1);
		}
		release_ui_entry_iterator(ui_iter);

		if (cached_config->res_rows <
			cached_config->n_resist_by_region[i]) {
			cached_config->res_rows =
				cached_config->n_resist_by_region[i];
		}
	}
	for (i = 0; i < 4; ++i) {
		cached_config->res_regions[i].page_rows =
			cached_config->res_rows + 2;
	}
}